

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::CompositePayloadRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               PayloadCompositionOptions *options)

{
  Path *pPVar1;
  Layer *pLVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  anon_struct_8_0_00000001_for___align aVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  PrimSpec *extraout_RDX;
  PrimSpec *extraout_RDX_00;
  PrimSpec *extraout_RDX_01;
  PrimSpec *extraout_RDX_02;
  PrimSpec *pPVar8;
  long lVar9;
  Payload *pl;
  PrimSpec *pPVar10;
  char *pcVar11;
  int iVar12;
  Layer *pLVar13;
  bool bVar14;
  PayloadCompositionOptions *in_stack_ffffffffffffe750;
  string local_18a0;
  PrimSpec *src_ps;
  long *local_1878 [2];
  long local_1868 [2];
  string *local_1858;
  Layer *local_1850;
  Layer *local_1848;
  PrimSpec *local_1840;
  AssetResolutionResolver *local_1838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1830;
  PrimSpec *local_1828;
  string asset_path;
  string local_17f8;
  string cwp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  ostringstream ss_e_1;
  _Rb_tree_node_base local_1790 [3];
  ios_base local_1730 [264];
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  storage_t<tinyusdz::value::StringData> local_1608;
  _Alloc_hider _Stack_15d8;
  LayerMetas local_15d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  local_a8;
  undefined8 local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  void *pvStack_38;
  
  local_1848 = (Layer *)asset_search_paths;
  local_1840 = primspec;
  if (*(uint *)&(err->_M_dataplus)._M_p < depth) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x30c);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"Too deep.",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)warn,(ulong)_ss_e_1);
      if (_ss_e_1 != local_1790) {
        operator_delete(_ss_e_1,local_1790[0]._0_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
    return false;
  }
  pLVar13 = (Layer *)(in_layer->_prim_specs)._M_h._M_rehash_policy._M_next_resize;
  pLVar2 = (Layer *)(in_layer->_prim_specs)._M_h._M_single_bucket;
  bVar14 = pLVar13 == pLVar2;
  local_1850 = in_layer;
  if (!bVar14) {
    bVar3 = CompositePayloadRec(depth + 1,resolver,asset_search_paths,pLVar13,primspec,warn,err,
                                in_stack_ffffffffffffe750);
    if (bVar3) {
      do {
        pLVar13 = (Layer *)((long)&(pLVar13->_metas).timeCodesPerSecond._metas.customData.contained
                           + 0x18);
        bVar14 = pLVar13 == pLVar2;
        if (bVar14) goto LAB_001acb3c;
        primspec = local_1840;
        bVar3 = CompositePayloadRec(depth + 1,resolver,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_1848,pLVar13,local_1840,warn,err,
                                    in_stack_ffffffffffffe750);
      } while (bVar3);
    }
    if (!bVar14) {
      return false;
    }
  }
LAB_001acb3c:
  pLVar13 = local_1850;
  cwp._M_dataplus._M_p = (pointer)&cwp.field_2;
  lVar9 = *(long *)((long)&(local_1850->_metas).timeCodesPerSecond._metas.comment.contained + 0x18);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&cwp,lVar9,
             *(long *)((long)&(local_1850->_metas).timeCodesPerSecond._metas.comment.contained +
                      0x20) + lVar9);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&search_paths,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(pLVar13->_metas).timeCodesPerSecond._metas.customData.contained);
  if (*(char *)((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 8) != '\x01')
  goto LAB_001add3f;
  switch(*(undefined4 *)((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 0x10))
  {
  case 0:
  case 4:
    pPVar10 = *(PrimSpec **)
               ((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 0x18);
    local_1828 = *(PrimSpec **)
                  ((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 0x20);
    if (pPVar10 != local_1828) {
      local_1830 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err->_M_string_length;
      local_1858 = (string *)&(pLVar13->_name)._M_string_length;
      local_1838 = resolver;
      do {
        asset_path._M_dataplus._M_p = (pointer)&asset_path.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&asset_path,*(long *)pPVar10,
                   (pPVar10->_typeName)._M_dataplus._M_p + *(long *)pPVar10);
        _ss_e = &local_1618;
        local_1618._M_local_buf[0] = '\0';
        aVar6 = (anon_struct_8_0_00000001_for___align)&_Stack_15d8;
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        _Stack_15d8._M_p = (pointer)0x0;
        local_1608.data.__align = aVar6;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        pPVar1 = (Path *)(&(pPVar10->_name).field_2._M_allocated_capacity + 1);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((pPVar10->_typeName)._M_dataplus._M_p == (pointer)0x0) {
          if (((pPVar10->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) &&
             (*(pPVar1->_prim_part)._M_dataplus._M_p == '/')) {
            bVar14 = Layer::find_primspec_at(local_1848,pPVar1,&src_ps,warn);
            iVar12 = 1;
            pPVar8 = extraout_RDX_00;
            if (bVar14) goto LAB_001acd71;
            goto LAB_001ad1fe;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x333);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          local_1878[0] = local_1868;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1878,"primPath is not absolute path: {}","");
          Path::full_path_name_abi_cxx11_(&local_17f8,pPVar1);
          fmt::format<std::__cxx11::string>
                    (&local_18a0,(fmt *)local_1878,(string *)&local_17f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aVar6);
          poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                              local_18a0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
            operator_delete(local_18a0._M_dataplus._M_p,local_18a0.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) {
            operator_delete(local_17f8._M_dataplus._M_p,local_17f8.field_2._M_allocated_capacity + 1
                           );
          }
          resolver = local_1838;
          if (local_1878[0] != local_1868) goto LAB_001ad18a;
LAB_001ad197:
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_18a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar12 = 1;
        }
        else {
          pbVar7 = local_1830;
          primspec = pPVar10;
          bVar14 = LoadAsset(resolver,&cwp,&search_paths,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                              *)local_1830,(AssetPath *)pPVar10,pPVar1,(Layer *)&ss_e,&src_ps,true,
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)local_1840,warn
                            );
          pPVar8 = extraout_RDX;
          if (!bVar14) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x33d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            local_1878[0] = local_1868;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1878,"Failed to `references` asset `{}`","");
            pPVar8 = pPVar10;
LAB_001ad134:
            fmt::format<std::__cxx11::string>(&local_18a0,(fmt *)local_1878,(string *)pPVar8,pbVar7)
            ;
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                                local_18a0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
            if (local_1878[0] != local_1868) {
LAB_001ad18a:
              operator_delete(local_1878[0],local_1868[0] + 1);
            }
            goto LAB_001ad197;
          }
LAB_001acd71:
          pLVar13 = local_1850;
          if (src_ps == (PrimSpec *)0x0) {
            iVar12 = 7;
          }
          else {
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)warn;
            bVar14 = InheritPrimSpec((tinyusdz *)local_1850,src_ps,pPVar8,warn,(string *)primspec);
            if (!bVar14) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x349);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              local_1878[0] = local_1868;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1878,"Failed to reference layer `{}`","");
              pPVar8 = (PrimSpec *)&asset_path;
              goto LAB_001ad134;
            }
            if ((pLVar13->_name).field_2._M_allocated_capacity != 0) {
              iVar4 = ::std::__cxx11::string::compare((char *)local_1858);
              iVar12 = 0;
              if (iVar4 != 0) goto LAB_001ad1fe;
            }
            iVar12 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar4 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar12 = 0,
               iVar4 != 0)) {
              ::std::__cxx11::string::_M_assign(local_1858);
            }
          }
        }
LAB_001ad1fe:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete((void *)_ss_e,
                          CONCAT71(local_1618._M_allocated_capacity._1_7_,local_1618._M_local_buf[0]
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)asset_path._M_dataplus._M_p != &asset_path.field_2) {
          operator_delete(asset_path._M_dataplus._M_p,asset_path.field_2._M_allocated_capacity + 1);
        }
        if ((iVar12 != 7) && (iVar12 != 0)) goto LAB_001ad2cf;
        pPVar10 = (PrimSpec *)&pPVar10->_variantChildren;
      } while (pPVar10 != local_1828);
    }
    iVar12 = 6;
LAB_001ad2cf:
    bVar14 = iVar12 == 6;
    goto LAB_001ada9f;
  case 1:
    pPVar10 = *(PrimSpec **)
               ((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 0x18);
    local_1828 = *(PrimSpec **)
                  ((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 0x20);
    if (pPVar10 != local_1828) {
      local_1830 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err->_M_string_length;
      local_1858 = (string *)&(pLVar13->_name)._M_string_length;
      local_1838 = resolver;
      do {
        asset_path._M_dataplus._M_p = (pointer)&asset_path.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&asset_path,*(long *)pPVar10,
                   (pPVar10->_typeName)._M_dataplus._M_p + *(long *)pPVar10);
        _ss_e = &local_1618;
        local_1618._M_local_buf[0] = '\0';
        aVar6 = (anon_struct_8_0_00000001_for___align)&_Stack_15d8;
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        _Stack_15d8._M_p = (pointer)0x0;
        local_1608.data.__align = aVar6;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        pPVar1 = (Path *)(&(pPVar10->_name).field_2._M_allocated_capacity + 1);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((pPVar10->_typeName)._M_dataplus._M_p == (pointer)0x0) {
          if (((pPVar10->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) &&
             (*(pPVar1->_prim_part)._M_dataplus._M_p == '/')) {
            bVar14 = Layer::find_primspec_at(local_1848,pPVar1,&src_ps,warn);
            iVar12 = 1;
            pPVar8 = extraout_RDX_02;
            if (bVar14) goto LAB_001ad52e;
            goto LAB_001ad9ca;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x372);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          local_1878[0] = local_1868;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1878,"primPath is not absolute path: {}","");
          Path::full_path_name_abi_cxx11_(&local_17f8,pPVar1);
          fmt::format<std::__cxx11::string>
                    (&local_18a0,(fmt *)local_1878,(string *)&local_17f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aVar6);
          poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                              local_18a0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
            operator_delete(local_18a0._M_dataplus._M_p,local_18a0.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) {
            operator_delete(local_17f8._M_dataplus._M_p,local_17f8.field_2._M_allocated_capacity + 1
                           );
          }
          resolver = local_1838;
          if (local_1878[0] != local_1868) goto LAB_001ad951;
LAB_001ad95e:
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_18a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar12 = 1;
        }
        else {
          pbVar7 = local_1830;
          primspec = pPVar10;
          bVar14 = LoadAsset(resolver,&cwp,&search_paths,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                              *)local_1830,(AssetPath *)pPVar10,pPVar1,(Layer *)&ss_e,&src_ps,true,
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                             *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)local_1840,warn
                            );
          pPVar8 = extraout_RDX_01;
          if (!bVar14) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x37c);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            local_1878[0] = local_1868;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1878,"Failed to `references` asset `{}`","");
            pPVar8 = pPVar10;
LAB_001ad8fb:
            fmt::format<std::__cxx11::string>(&local_18a0,(fmt *)local_1878,(string *)pPVar8,pbVar7)
            ;
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                                local_18a0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
            if (local_1878[0] != local_1868) {
LAB_001ad951:
              operator_delete(local_1878[0],local_1868[0] + 1);
            }
            goto LAB_001ad95e;
          }
LAB_001ad52e:
          pLVar13 = local_1850;
          if (src_ps == (PrimSpec *)0x0) {
            iVar12 = 0x17;
          }
          else {
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)warn;
            bVar14 = OverridePrimSpec((tinyusdz *)local_1850,src_ps,pPVar8,warn,(string *)primspec);
            if (!bVar14) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x388);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              local_1878[0] = local_1868;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1878,"Failed to reference layer `{}`","");
              pPVar8 = (PrimSpec *)&asset_path;
              goto LAB_001ad8fb;
            }
            if ((pLVar13->_name).field_2._M_allocated_capacity != 0) {
              iVar4 = ::std::__cxx11::string::compare((char *)local_1858);
              iVar12 = 0;
              if (iVar4 != 0) goto LAB_001ad9ca;
            }
            iVar12 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar4 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar12 = 0,
               iVar4 != 0)) {
              ::std::__cxx11::string::_M_assign(local_1858);
            }
          }
        }
LAB_001ad9ca:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete((void *)_ss_e,
                          CONCAT71(local_1618._M_allocated_capacity._1_7_,local_1618._M_local_buf[0]
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)asset_path._M_dataplus._M_p != &asset_path.field_2) {
          operator_delete(asset_path._M_dataplus._M_p,asset_path.field_2._M_allocated_capacity + 1);
        }
        if ((iVar12 != 0x17) && (iVar12 != 0)) goto LAB_001ada9b;
        pPVar10 = (PrimSpec *)&pPVar10->_variantChildren;
      } while (pPVar10 != local_1828);
    }
    iVar12 = 0x16;
LAB_001ada9b:
    bVar14 = iVar12 == 0x16;
LAB_001ada9f:
    pLVar13 = local_1850;
    if (bVar14) {
switchD_001acbac_default:
      iVar12 = 0;
    }
    goto LAB_001add36;
  case 2:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x35b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar11 = "`add` references are not supported yet.";
    lVar9 = 0x27;
    break;
  case 3:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x359);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar11 = "`delete` references are not supported yet.";
    lVar9 = 0x2a;
    break;
  case 5:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x35d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar11 = "`order` references are not supported yet.";
    lVar9 = 0x29;
    break;
  case 6:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x35f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar11 = "Invalid listedit qualifier to for `references`.";
    lVar9 = 0x2f;
    break;
  default:
    goto switchD_001acbac_default;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,pcVar11,lVar9);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
  if (warn != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)warn,(ulong)_ss_e_1);
    if (_ss_e_1 != local_1790) {
      operator_delete(_ss_e_1,local_1790[0]._0_8_ + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
  iVar12 = 1;
LAB_001add36:
  if (iVar12 == 0) {
LAB_001add3f:
    if (*(char *)((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 8) == '\x01')
    {
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 ((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 0x18));
    }
    *(undefined1 *)((long)&(pLVar13->_metas).metersPerUnit._metas.customData.contained + 8) = 0;
    bVar14 = true;
  }
  else {
    bVar14 = false;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&search_paths);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cwp._M_dataplus._M_p != &cwp.field_2) {
    operator_delete(cwp._M_dataplus._M_p,cwp.field_2._M_allocated_capacity + 1);
  }
  return bVar14;
}

Assistant:

bool CompositePayloadRec(uint32_t depth, AssetResolutionResolver &resolver,
                         const std::vector<std::string> &asset_search_paths,
                         const Layer &in_layer,
                         PrimSpec &primspec /* [inout] */, std::string *warn,
                         std::string *err,
                         const PayloadCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositePayloadRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                             warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().payload) {
    const ListEditQual &qual = primspec.metas().payload.value().first;
    const auto &payloads = primspec.metas().payload.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();
        DCOUT("asset_path = " << asset_path);

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `payload`.
  primspec.metas().payload.reset();

  return true;
}